

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O0

void __thiscall
Omega_h::Overlay::Overlay
          (Overlay *this,int *argc,char ***argv,Vector<3> *overlayGridCenter,double cellSize,
          size_t Nx,size_t Ny,size_t Nz)

{
  int iVar1;
  LO LVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  LO nz;
  undefined4 uVar9;
  undefined1 auVar8 [16];
  Adj local_480;
  Adj local_450;
  Adj local_420;
  Adj local_3f0;
  Write<double> local_3c0;
  Read<double> local_3b0 [2];
  element_type *local_388;
  double local_380;
  double local_378;
  size_t local_370;
  Vector<3> x;
  _Base_ptr p_Stack_350;
  int i_5;
  Vector<3> v;
  element_type *local_318;
  Vector<3> diff;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  Write<double> new_coords;
  Reals coords;
  int local_2ac;
  value_type_conflict3 vStack_2a8;
  int i_3;
  int local_29c;
  value_type_conflict3 vStack_298;
  int i_2;
  int local_28c;
  value_type_conflict3 vStack_288;
  int i_1;
  int local_280;
  int i;
  undefined1 local_270 [24];
  size_t Ny_local;
  size_t Nx_local;
  double cellSize_local;
  Vector<3> *overlayGridCenter_local;
  char ***argv_local;
  int *argc_local;
  Overlay *this_local;
  _Base_ptr local_220;
  _Base_ptr local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  double local_208;
  double local_200;
  int local_1f4;
  double dStack_1f0;
  Int i_4;
  double local_1e8;
  double local_1e0;
  int local_1d8;
  int local_1d4;
  Int j;
  element_type *local_1c8;
  double local_1c0;
  double local_1b8;
  element_type *local_1b0;
  double local_1a8;
  double local_1a0;
  double local_180;
  Vector<3> c_1;
  size_t local_160 [3];
  int local_148;
  int local_144;
  Int j_1;
  int local_134;
  size_t *local_130;
  int local_124;
  size_t *local_120;
  undefined4 local_114;
  undefined1 *local_110;
  undefined4 local_104;
  undefined1 *local_100;
  undefined4 local_f4;
  undefined1 *local_f0;
  int local_e4;
  element_type **local_e0;
  int local_d4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_d0;
  int local_c4;
  Overlay **local_c0;
  int local_b4;
  void **local_b0;
  int local_a4;
  void **local_a0;
  int local_94;
  undefined1 *local_90;
  undefined1 *local_88;
  void **local_80;
  void **local_78;
  undefined1 *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_68;
  element_type *local_50;
  double local_48;
  double local_40;
  int local_38;
  int local_34;
  Int i_6;
  int local_24;
  element_type **local_20;
  int local_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  undefined1 auVar7 [16];
  
  this->cell_size = cellSize;
  local_270._16_8_ = Ny;
  Ny_local = Nx;
  Nx_local = (size_t)cellSize;
  cellSize_local = (double)overlayGridCenter;
  overlayGridCenter_local = (Vector<3> *)argv;
  argv_local = (char ***)argc;
  argc_local = (int *)this;
  Library::Library(&this->library,argc,argv);
  Library::world((Library *)local_270);
  auVar3._8_4_ = (int)(Ny_local >> 0x20);
  auVar3._0_8_ = Ny_local;
  auVar3._12_4_ = 0x45300000;
  auVar5._8_4_ = SUB84(local_270._16_8_,4);
  auVar5._0_8_ = local_270._16_8_;
  auVar5._12_4_ = 0x45300000;
  uVar9 = (undefined4)(Nz >> 0x20);
  auVar7._8_4_ = uVar9;
  auVar7._0_8_ = Nz;
  auVar7._12_4_ = 0x45300000;
  nz = (LO)Nz;
  build_box(&this->mesh,(CommPtr *)local_270,OMEGA_H_HYPERCUBE,
            ((auVar3._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(LO)Ny_local) - 4503599627370496.0)) * (double)Nx_local,
            ((auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(LO)local_270._16_8_) - 4503599627370496.0)) *
            (double)Nx_local,
            ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,nz) - 4503599627370496.0)) * (double)Nx_local,(LO)Ny_local,
            (LO)local_270._16_8_,nz,false);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_270);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->silly_cells);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->silly_edges);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->silly_faces);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->silly_nodes);
  LVar2 = Omega_h::Mesh::nregions(&this->mesh);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_cells,(long)LVar2);
  LVar2 = Omega_h::Mesh::nfaces(&this->mesh);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_faces,(long)LVar2);
  LVar2 = Omega_h::Mesh::nedges(&this->mesh);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_edges,(long)LVar2);
  LVar2 = Omega_h::Mesh::nverts(&this->mesh);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&this->silly_nodes,(long)LVar2);
  local_280 = 0;
  while( true ) {
    iVar1 = local_280;
    LVar2 = Omega_h::Mesh::nregions(&this->mesh);
    if (LVar2 <= iVar1) break;
    vStack_288 = (value_type_conflict3)local_280;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->silly_cells,&stack0xfffffffffffffd78);
    local_280 = local_280 + 1;
  }
  local_28c = 0;
  while( true ) {
    iVar1 = local_28c;
    LVar2 = Omega_h::Mesh::nfaces(&this->mesh);
    if (LVar2 <= iVar1) break;
    vStack_298 = (value_type_conflict3)local_28c;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->silly_faces,&stack0xfffffffffffffd68);
    local_28c = local_28c + 1;
  }
  local_29c = 0;
  while( true ) {
    iVar1 = local_29c;
    LVar2 = Omega_h::Mesh::nedges(&this->mesh);
    if (LVar2 <= iVar1) break;
    vStack_2a8 = (value_type_conflict3)local_29c;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->silly_edges,&stack0xfffffffffffffd58);
    local_29c = local_29c + 1;
  }
  local_2ac = 0;
  while( true ) {
    LVar2 = Omega_h::Mesh::nverts(&this->mesh);
    if (LVar2 <= local_2ac) break;
    coords.write_.shared_alloc_.direct_ptr = (void *)(long)local_2ac;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->silly_nodes,(value_type_conflict3 *)&coords.write_.shared_alloc_.direct_ptr);
    local_2ac = local_2ac + 1;
  }
  Omega_h::Mesh::coords((Mesh *)&new_coords.shared_alloc_.direct_ptr);
  LVar2 = Omega_h::Mesh::nverts(&this->mesh);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2f8,"",(allocator *)((long)diff.super_Few<double,_3>.array_ + 0x17));
  Write<double>::Write((Write<double> *)local_2d8,LVar2 * 3,(string *)local_2f8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)diff.super_Few<double,_3>.array_ + 0x17));
  local_218 = *(_Base_ptr *)((long)cellSize_local + 0x10);
  v.super_Few<double,_3>.array_[2] = *(double *)cellSize_local;
  local_220 = *(_Base_ptr *)((long)cellSize_local + 8);
  auVar8._8_4_ = (int)(Ny_local >> 0x20);
  auVar8._0_8_ = Ny_local;
  auVar8._12_4_ = 0x45300000;
  local_1e0 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)Ny_local) - 4503599627370496.0)) * (double)Nx_local
              * 0.5;
  auVar6._8_4_ = SUB84(local_270._16_8_,4);
  auVar6._0_8_ = local_270._16_8_;
  auVar6._12_4_ = 0x45300000;
  local_1e8 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_270._16_8_) - 4503599627370496.0)) *
              (double)Nx_local * 0.5;
  auVar4._8_4_ = uVar9;
  auVar4._0_8_ = Nz;
  auVar4._12_4_ = 0x45300000;
  dStack_1f0 = (((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,nz) - 4503599627370496.0)) * (double)Nx_local) / 2.0;
  local_f0 = (undefined1 *)&stack0xfffffffffffffcb0;
  local_f4 = 0;
  local_100 = (undefined1 *)&stack0xfffffffffffffcb0;
  local_104 = 1;
  local_110 = (undefined1 *)&stack0xfffffffffffffcb0;
  local_114 = 2;
  local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_350;
  local_208 = v.super_Few<double,_3>.array_[0];
  local_200 = v.super_Few<double,_3>.array_[1];
  for (local_1f4 = 0; local_1f4 < 3; local_1f4 = local_1f4 + 1) {
    local_c4 = local_1f4;
    local_c0 = &this_local;
    local_d4 = local_1f4;
    local_d0 = &local_210;
    local_e4 = local_1f4;
    local_e0 = &local_318;
    local_e0[local_1f4] =
         (element_type *)((double)local_c0[local_1f4] - (double)local_d0[local_1f4]._M_pi);
  }
  x.super_Few<double,_3>.array_[2]._4_4_ = 0;
  this_local = (Overlay *)v.super_Few<double,_3>.array_[2];
  while( true ) {
    iVar1 = x.super_Few<double,_3>.array_[2]._4_4_;
    LVar2 = Omega_h::Mesh::nverts(&this->mesh);
    if (LVar2 <= iVar1) break;
    _j = &new_coords.shared_alloc_.direct_ptr;
    local_1d4 = x.super_Few<double,_3>.array_[2]._4_4_;
    for (local_1d8 = 0; local_1d8 < 3; local_1d8 = local_1d8 + 1) {
      local_b4 = x.super_Few<double,_3>.array_[2]._4_4_ * 3 + local_1d8;
      local_124 = local_1d8;
      local_120 = &local_370;
      local_120[local_1d8] = (&(coords.write_.shared_alloc_.alloc)->size)[local_b4];
      local_b0 = _j;
      local_a4 = local_b4;
      local_a0 = _j;
      local_80 = _j;
      local_78 = _j;
    }
    local_388 = local_318;
    local_380 = diff.super_Few<double,_3>.array_[0];
    local_378 = diff.super_Few<double,_3>.array_[1];
    local_1c8 = local_318;
    local_1c0 = diff.super_Few<double,_3>.array_[0];
    local_1b8 = diff.super_Few<double,_3>.array_[1];
    c_1.super_Few<double,_3>.array_[2] = (double)&local_370;
    local_1b0 = local_318;
    local_1a8 = diff.super_Few<double,_3>.array_[0];
    local_1a0 = diff.super_Few<double,_3>.array_[1];
    local_50 = local_318;
    local_48 = diff.super_Few<double,_3>.array_[0];
    local_40 = diff.super_Few<double,_3>.array_[1];
    for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
      local_14 = local_38;
      local_10 = &local_68;
      local_24 = local_38;
      local_20 = &local_50;
      local_34 = local_38;
      _i_6 = &local_180;
      _i_6[local_38] =
           (double)(&local_10->_vptr__Sp_counted_base)[local_38] + (double)local_20[local_38];
    }
    local_144 = x.super_Few<double,_3>.array_[2]._4_4_;
    _j_1 = local_2d8;
    for (local_148 = 0; local_148 < 3; local_148 = local_148 + 1) {
      local_134 = local_148;
      local_130 = local_160;
      local_94 = x.super_Few<double,_3>.array_[2]._4_4_ * 3 + local_148;
      (&(new_coords.shared_alloc_.alloc)->size)[local_94] = local_130[local_148];
      local_90 = _j_1;
      local_88 = _j_1;
      local_70 = _j_1;
    }
    x.super_Few<double,_3>.array_[2]._4_4_ = x.super_Few<double,_3>.array_[2]._4_4_ + 1;
  }
  Write<double>::Write(&local_3c0,(Write<double> *)local_2d8);
  Read<double>::Read(local_3b0,&local_3c0);
  Omega_h::Mesh::set_coords(&this->mesh,local_3b0);
  Read<double>::~Read(local_3b0);
  Write<double>::~Write(&local_3c0);
  Omega_h::Mesh::ask_down(&local_3f0,&this->mesh,2,0);
  Adj::~Adj(&local_3f0);
  Omega_h::Mesh::ask_down(&local_420,&this->mesh,3,0);
  Adj::~Adj(&local_420);
  Omega_h::Mesh::ask_down(&local_450,&this->mesh,3,2);
  Adj::~Adj(&local_450);
  Omega_h::Mesh::ask_up(&local_480,&this->mesh,2,3);
  Adj::~Adj(&local_480);
  Write<double>::~Write((Write<double> *)local_2d8);
  Read<double>::~Read((Read<double> *)&new_coords.shared_alloc_.direct_ptr);
  return;
}

Assistant:

Overlay::Overlay(
    int* argc, char*** argv, const Omega_h::Vector<3>& overlayGridCenter,
    double cellSize, size_t Nx, size_t Ny, size_t Nz
#ifdef OMEGA_H_USE_MPI
    ,
    MPI_Comm comm
#endif
    )
    : cell_size(cellSize),
      library(argc, argv
#ifdef OMEGA_H_USE_MPI
          ,
          comm
#endif
          ),
      mesh(build_box(library.world(), OMEGA_H_HYPERCUBE, Nx * cellSize,
          Ny * cellSize, Nz * cellSize, LO(Nx), LO(Ny), LO(Nz))) {
  silly_cells.reserve(size_t(mesh.nregions()));
  silly_faces.reserve(size_t(mesh.nfaces()));
  silly_edges.reserve(size_t(mesh.nedges()));
  silly_nodes.reserve(size_t(mesh.nverts()));
  for (int i = 0; i < mesh.nregions(); ++i) silly_cells.push_back(size_t(i));
  for (int i = 0; i < mesh.nfaces(); ++i) silly_faces.push_back(size_t(i));
  for (int i = 0; i < mesh.nedges(); ++i) silly_edges.push_back(size_t(i));
  for (int i = 0; i < mesh.nverts(); ++i) silly_nodes.push_back(size_t(i));
  auto coords = mesh.coords();
  auto new_coords = Write<double>(mesh.nverts() * 3);
  auto diff = overlayGridCenter - vector_3(Nx * cellSize / 2.0,
                                      Ny * cellSize / 2.0, Nz * cellSize / 2.0);
  for (int i = 0; i < mesh.nverts(); ++i) {
    auto x = get_vector<3>(coords, i);
    x += diff;
    set_vector(new_coords, i, x);
  }
  mesh.set_coords(new_coords);
  mesh.ask_down(FACE, VERT);
  mesh.ask_down(REGION, VERT);
  mesh.ask_down(REGION, FACE);
  mesh.ask_up(FACE, REGION);
}